

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rate_adaptive_code.cpp
# Opt level: O2

void __thiscall
rate_adaptive_code_from_colptr_rowIdx_encode_with_ra_Test::
~rate_adaptive_code_from_colptr_rowIdx_encode_with_ra_Test
          (rate_adaptive_code_from_colptr_rowIdx_encode_with_ra_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(rate_adaptive_code_from_colptr_rowIdx, encode_with_ra) {
    auto H = get_code_big_wra();

    std::vector<Bit> input = get_bitstring(H.getNCols()); // true data to be sent

    // storage for syndrome. Initialize with arbitrary values, which must be overwritten by encoder.
    std::vector<Bit> syndrome = get_bitstring(H.get_n_rows_mother_matrix());

    // test agreement with encoder that doesn't use rate adaption
    H.encode_with_ra(input, syndrome, H.get_n_rows_mother_matrix());

    EXPECT_EQ(hash_vector(syndrome), 2814594723);

    // check that invalid requests lead to exceptions
    EXPECT_ANY_THROW(H.encode_with_ra({true, false}, syndrome, 0xbadb'eeff'ffff'aaaa));  // invalid input size
    EXPECT_ANY_THROW(H.encode_with_ra(input, syndrome, 0xbadb'eeff'ffff'ffff)); // invalid requested size
    EXPECT_ANY_THROW(H.encode_with_ra(input, syndrome, H.get_n_rows_mother_matrix() + 1)); // too big requested size

    H.encode_with_ra(input, syndrome, H.get_n_rows_mother_matrix() / 2 + 1);
    EXPECT_EQ(hash_vector(syndrome), 0x4e395580);

    H.encode_with_ra(input, syndrome,
                     static_cast<size_t>(static_cast<double>(H.get_n_rows_mother_matrix()) * 0.7));
    EXPECT_EQ(hash_vector(syndrome), 0x01dab680);
}